

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O1

void __thiscall
QColorTransformPrivate::applyConvertOut<QCmyk32,unsigned_int>
          (QColorTransformPrivate *this,QCmyk32 *dst,uint *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  QColorSpacePrivate *pQVar1;
  undefined1 auVar2 [16];
  long lVar3;
  QColorVector *pQVar4;
  long lVar5;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *pvVar6;
  _Array_type *__vtable;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QColorVector QVar8;
  anon_class_16_2_4b7f43a0 local_50;
  QColorVector *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->colorSpaceOut).d.ptr;
  lVar5 = (pQVar1->mBA).d.size;
  local_40 = buffer;
  if (lVar5 != 0) {
    pvVar6 = (pQVar1->mBA).d.ptr;
    lVar5 = lVar5 * 0x1c8;
    do {
      lVar3 = (long)(char)*(__index_type *)
                           ((long)&(pvVar6->
                                   super__Variant_base<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   ).
                                   super__Move_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Copy_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Move_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Copy_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                   .
                                   super__Variant_storage_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                           + 0x1c0);
      local_50.buffer = &local_40;
      local_50.len = len;
      if (lVar3 == -1) {
        abort();
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qcolortransform.cpp:1932:24)_&&,_const_std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_&>
        ::_S_vtable._M_arr[lVar3]._M_data)(&local_50,pvVar6);
      pvVar6 = pvVar6 + 1;
      lVar5 = lVar5 + -0x1c8;
    } while (lVar5 != 0);
  }
  auVar2 = _DAT_006a97c0;
  pQVar4 = local_40;
  lVar5 = len;
  if (0 < len) {
    do {
      auVar7 = minps((undefined1  [16])*pQVar4,auVar2);
      QVar8 = (QColorVector)maxps(auVar7,ZEXT816(0));
      *pQVar4 = QVar8;
      lVar5 = lVar5 + -1;
      pQVar4 = pQVar4 + 1;
    } while (lVar5 != 0);
  }
  storeUnpremultipliedLUT<unsigned_int>(dst,src,local_40,len);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::applyConvertOut(D *dst, const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    constexpr ApplyMatrixForm doClamp = UnclampedValues<D> ? DoNotClamp : DoClamp;
    if constexpr (IsGrayscale<D>) {
        Q_UNUSED(src); // dealing with buggy warnings in gcc 9
        Q_UNUSED(flags);
        // Calculate the matrix for grayscale conversion
        QColorMatrix grayMatrix;
        if (colorSpaceIn == colorSpaceOut ||
                (colorSpaceIn->colorModel == QColorSpace::ColorModel::Gray &&
                 colorSpaceOut->colorModel == QColorSpace::ColorModel::Gray)) {
            // colorMatrix already has the right form
            grayMatrix = colorMatrix;
        } else {
            if constexpr (IsGrayscale<S>) {
                if (colorSpaceIn->colorModel == QColorSpace::ColorModel::Gray)
                    grayMatrix = colorSpaceIn->chad;
                else
                    grayMatrix = QColorMatrix::identity(); // Otherwise already handled in applyConvertIn
            } else {
                if (colorSpaceIn->isThreeComponentMatrix())
                    grayMatrix = colorSpaceIn->toXyz;
                else
                    grayMatrix = QColorMatrix::identity();
            }
            if (!colorSpaceOut->chad.isNull())
                grayMatrix = colorSpaceOut->chad.inverted() * grayMatrix;
        }

        applyMatrix<doClamp>(buffer, len, grayMatrix);
        storeOpaque(dst, buffer, len, this);
        return;
    } else if constexpr (CanUseThreeComponent<D>) {
        if (colorSpaceOut->isThreeComponentMatrix()) {
            if (IsGrayscale<S> && colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray)
                applyMatrix<doClamp>(buffer, len, colorSpaceOut->toXyz.inverted()); // colorMatrix wasnt prepared for gray input
            else
                applyMatrix<doClamp>(buffer, len, colorMatrix);

            if constexpr (IsAlwaysOpaque<S>) {
                storeOpaque(dst, buffer, len, this);
            } else {
                if (flags & InputOpaque)
                    storeOpaque(dst, buffer, len, this);
                else if (flags & OutputPremultiplied)
                    storePremultiplied(dst, src, buffer, len, this);
                else
                    storeUnpremultiplied(dst, src, buffer, len, this);
            }
            return;
        }
    }
    if constexpr (!IsGrayscale<D>) {
        Q_ASSERT(!colorSpaceOut->isThreeComponentMatrix());

        // Do element based conversion
        for (auto &&element : colorSpaceOut->mBA)
            std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);

        clampIfNeeded<doClamp>(buffer, len);

        if (flags & OutputPremultiplied)
            storePremultipliedLUT(dst, src, buffer, len);
        else
            storeUnpremultipliedLUT(dst, src, buffer, len);
    } else {
        Q_UNREACHABLE();
    }
}